

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::DeepScanLineInputFile::readPixelSampleCounts
          (DeepScanLineInputFile *this,int scanline1,int scanline2)

{
  long *plVar1;
  ArgExc *pAVar2;
  int *piVar3;
  bool *pbVar4;
  long in_RDI;
  stringstream _iex_replace_s;
  BaseExc *e;
  int maxYInLineBuffer;
  int minYInLineBuffer;
  int lineBlockId;
  int i;
  int scanLineMax;
  int scanLineMin;
  Lock lock;
  Int64 savedFilePos;
  int in_stack_000006d4;
  Data *in_stack_000006d8;
  InputStreamMutex *in_stack_000006e0;
  Lock *in_stack_fffffffffffffdc0;
  Mutex *in_stack_fffffffffffffdc8;
  Lock *in_stack_fffffffffffffdd0;
  Data *in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffde4;
  int in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdec;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffdf0;
  char *in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  Header *in_stack_fffffffffffffe30;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe40;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  undefined8 local_18;
  int local_10;
  int local_c [3];
  
  local_18 = 0;
  if ((*(byte *)(*(long *)(in_RDI + 8) + 0x1d0) & 1) == 0) {
    pAVar2 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar2,"readPixelSampleCounts called with no valid frame buffer");
    __cxa_throw(pAVar2,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  IlmThread_2_5::Lock::Lock
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
             SUB81((ulong)in_stack_fffffffffffffdc0 >> 0x38,0));
  local_18 = (**(code **)(**(long **)(*(long *)(*(long *)(in_RDI + 8) + 0x1f8) + 0x28) + 0x28))();
  piVar3 = std::min<int>(local_c,&local_10);
  local_38 = *piVar3;
  piVar3 = std::max<int>(local_c,&local_10);
  local_3c = *piVar3;
  if ((*(int *)(*(long *)(in_RDI + 8) + 0xdc) <= local_38) &&
     (local_3c <= *(int *)(*(long *)(in_RDI + 8) + 0xe0))) {
    for (local_40 = local_38; local_40 <= local_3c; local_40 = local_40 + 1) {
      pbVar4 = Array::operator_cast_to_bool_((Array *)(*(long *)(in_RDI + 8) + 0x1b0));
      if ((pbVar4[local_40 - *(int *)(*(long *)(in_RDI + 8) + 0xdc)] & 1U) == 0) {
        local_44 = (local_40 - *(int *)(*(long *)(in_RDI + 8) + 0xdc)) /
                   *(int *)(*(long *)(in_RDI + 8) + 0x168);
        anon_unknown_6::readSampleCountForLineBlock
                  (in_stack_000006e0,in_stack_000006d8,in_stack_000006d4);
        local_48 = local_44 * *(int *)(*(long *)(in_RDI + 8) + 0x168) +
                   *(int *)(*(long *)(in_RDI + 8) + 0xdc);
        local_50 = local_48 + -1 + *(int *)(*(long *)(in_RDI + 8) + 0x168);
        in_stack_fffffffffffffdc0 =
             (Lock *)std::min<int>(&local_50,(int *)(*(long *)(in_RDI + 8) + 0xe0));
        local_4c = *(int *)&in_stack_fffffffffffffdc0->_mutex;
        bytesPerDeepLineTable
                  (in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28,
                   in_stack_fffffffffffffe20,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                   in_stack_fffffffffffffe40);
        offsetInLineBufferTable
                  (in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,in_stack_fffffffffffffde8,
                   in_stack_fffffffffffffde4,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffdd8);
      }
      else {
        anon_unknown_6::fillSampleCountFromCache
                  (in_stack_fffffffffffffde4,in_stack_fffffffffffffdd8);
      }
    }
    plVar1 = *(long **)(*(long *)(*(long *)(in_RDI + 8) + 0x1f8) + 0x28);
    (**(code **)(*plVar1 + 0x30))(plVar1,local_18);
    IlmThread_2_5::Lock::~Lock(in_stack_fffffffffffffdc0);
    return;
  }
  pAVar2 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc
            (pAVar2,"Tried to read scan line sample counts outside the image file\'s data window.");
  __cxa_throw(pAVar2,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void
DeepScanLineInputFile::readPixelSampleCounts (int scanline1, int scanline2)
{
    Int64 savedFilePos = 0;

    if(!_data->frameBufferValid)
    {
        throw IEX_NAMESPACE::ArgExc("readPixelSampleCounts called with no valid frame buffer");
    }
    
    try
    {
        Lock lock (*_data->_streamData);

        savedFilePos = _data->_streamData->is->tellg();

        int scanLineMin = min (scanline1, scanline2);
        int scanLineMax = max (scanline1, scanline2);

        if (scanLineMin < _data->minY || scanLineMax > _data->maxY)
            throw IEX_NAMESPACE::ArgExc ("Tried to read scan line sample counts outside "
                               "the image file's data window.");

        for (int i = scanLineMin; i <= scanLineMax; i++)
        {
            //
            // if scanline is already read, it'll be in the cache
            // otherwise, read from file, store in cache and in caller's framebuffer
            //
            if (_data->gotSampleCount[i - _data->minY])
            {
                fillSampleCountFromCache(i,_data);
                                         
            }else{

                int lineBlockId = ( i - _data->minY ) / _data->linesInBuffer;

                readSampleCountForLineBlock ( _data->_streamData, _data, lineBlockId );

                int minYInLineBuffer = lineBlockId * _data->linesInBuffer + _data->minY;
                int maxYInLineBuffer = min ( minYInLineBuffer + _data->linesInBuffer - 1, _data->maxY );

                //
                // For each line within the block, get the count of bytes.
                //

                bytesPerDeepLineTable ( _data->header,
                                        minYInLineBuffer,
                                        maxYInLineBuffer,
                                        _data->sampleCountSliceBase,
                                        _data->sampleCountXStride,
                                        _data->sampleCountYStride,
                                        _data->bytesPerLine );

                //
                // For each scanline within the block, get the offset.
                //

                offsetInLineBufferTable ( _data->bytesPerLine,
                                          minYInLineBuffer - _data->minY,
                                          maxYInLineBuffer - _data->minY,
                                          _data->linesInBuffer,
                                          _data->offsetInLineBuffer );
            }
        }

        _data->_streamData->is->seekg(savedFilePos);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        REPLACE_EXC (e, "Error reading sample count data from image "
                     "file \"" << fileName() << "\". " << e.what());

        _data->_streamData->is->seekg(savedFilePos);

        throw;
    }
}